

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

int __thiscall
ncnn::Requantize::forward(Requantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar1;
  float scale_out_2;
  float bias_2;
  float scale_in_2;
  char *ptr_2;
  int *intptr_2;
  int q;
  float scale_out_1;
  float bias_1;
  float scale_in_1;
  char *ptr_1;
  int *intptr_1;
  int i;
  float scale_out;
  float bias;
  float scale_in;
  char *ptr;
  int *intptr;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m;
  Mat *m_1;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  Allocator *in_stack_fffffffffffffb50;
  Mat *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb68;
  Mat *in_stack_fffffffffffffb70;
  int *in_stack_fffffffffffffb78;
  undefined4 local_450;
  undefined4 local_44c;
  undefined4 local_448;
  undefined4 local_444;
  undefined4 local_434;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined4 local_3f0;
  long local_3e8;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined8 local_3c8;
  Mat *local_3c0;
  int local_3a8 [8];
  long local_388;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  undefined4 local_374;
  undefined4 local_370;
  undefined8 local_368;
  long local_360;
  int local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  long local_348;
  long local_340;
  int local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined4 local_32c;
  long local_328;
  long local_320;
  int local_318;
  int local_314;
  undefined4 local_310;
  int local_30c;
  long *local_300;
  long *local_2f8;
  int *local_2e0;
  undefined8 *local_2d0;
  long *local_2c0;
  long *local_2b8;
  long *local_2b0;
  int *local_2a8;
  long *local_2a0;
  undefined8 *local_298;
  long *local_290;
  long local_288;
  long local_280;
  undefined8 local_278;
  long local_270;
  long local_268;
  long local_260;
  undefined8 local_258;
  long local_250;
  long local_248;
  long local_240;
  undefined8 local_238;
  long local_230;
  long local_228;
  long *local_220;
  undefined8 local_218;
  undefined8 *local_210;
  long local_208;
  long *local_200;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  long local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  undefined8 *local_1c0;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  undefined8 *local_1a0;
  int local_194;
  long *local_190;
  int local_184;
  long *local_180;
  undefined1 local_175;
  int local_174;
  int *local_168;
  undefined1 local_155;
  int local_154;
  undefined8 *local_148;
  undefined8 *local_100;
  int *local_e0;
  long *local_a8;
  long *local_a0;
  long *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  Mat *local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_30c = (int)in_RSI[5];
  local_310 = *(undefined4 *)((long)in_RSI + 0x2c);
  local_314 = (int)in_RSI[6];
  local_318 = (int)in_RSI[7];
  local_300 = in_RDX;
  local_2f8 = in_RSI;
  if (local_30c == 1) {
    Mat::create(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                (size_t)in_stack_fffffffffffffb50,
                (Allocator *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_2b0 = local_300;
    bVar1 = true;
    if (*local_300 != 0) {
      local_a8 = local_300;
      bVar1 = local_300[8] * (long)(int)local_300[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    local_2a0 = local_2f8;
    local_320 = *local_2f8;
    local_290 = local_300;
    local_328 = *local_300;
    local_1a0 = (undefined8 *)(in_RDI + 0x128);
    local_1a8 = 0;
    local_32c = *(undefined4 *)*local_1a0;
    if (*(int *)(in_RDI + 0xd8) == 0) {
      local_434 = 0;
    }
    else {
      local_1b0 = (undefined8 *)(in_RDI + 0x1b8);
      local_1b8 = 0;
      local_434 = *(undefined4 *)*local_1b0;
    }
    local_330 = local_434;
    local_1c0 = (undefined8 *)(in_RDI + 0x170);
    local_1c8 = 0;
    local_334 = *(undefined4 *)*local_1c0;
    requantize(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
               (float)((ulong)in_stack_fffffffffffffb68 >> 0x20),(float)in_stack_fffffffffffffb68,
               (float)((ulong)in_stack_fffffffffffffb60 >> 0x20),(int)in_stack_fffffffffffffb60,
               in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
  }
  if (local_30c == 2) {
    Mat::create(in_stack_fffffffffffffb60,(int)((ulong)in_stack_fffffffffffffb58 >> 0x20),
                (int)in_stack_fffffffffffffb58,(size_t)in_stack_fffffffffffffb50,
                (Allocator *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
    local_2b8 = local_300;
    bVar1 = true;
    if (*local_300 != 0) {
      local_a0 = local_300;
      bVar1 = local_300[8] * (long)(int)local_300[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    for (local_338 = 0; local_338 < local_314; local_338 = local_338 + 1) {
      local_190 = local_2f8;
      local_194 = local_338;
      local_340 = *local_2f8 +
                  (long)*(int *)((long)local_2f8 + 0x2c) * (long)local_338 * local_2f8[2];
      local_180 = local_300;
      local_184 = local_338;
      local_348 = *local_300 +
                  (long)*(int *)((long)local_300 + 0x2c) * (long)local_338 * local_300[2];
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_1d0 = (undefined8 *)(in_RDI + 0x128);
        local_1d8 = 0;
        local_444 = *(undefined4 *)*local_1d0;
      }
      else {
        local_1e0 = (long *)(in_RDI + 0x128);
        local_1e8 = (long)local_338;
        local_444 = *(undefined4 *)(*local_1e0 + local_1e8 * 4);
      }
      local_34c = local_444;
      if (*(int *)(in_RDI + 0xd8) == 0) {
        local_448 = 0;
      }
      else {
        if (*(int *)(in_RDI + 0xd8) == 1) {
          local_1f0 = (undefined8 *)(in_RDI + 0x1b8);
          local_1f8 = 0;
          local_44c = *(undefined4 *)*local_1f0;
        }
        else {
          local_200 = (long *)(in_RDI + 0x1b8);
          local_208 = (long)local_338;
          local_44c = *(undefined4 *)(*local_200 + local_208 * 4);
        }
        local_448 = local_44c;
      }
      local_350 = local_448;
      if (*(int *)(in_RDI + 0xd4) == 1) {
        local_210 = (undefined8 *)(in_RDI + 0x170);
        local_218 = 0;
        local_450 = *(undefined4 *)*local_210;
      }
      else {
        local_220 = (long *)(in_RDI + 0x170);
        local_228 = (long)local_338;
        local_450 = *(undefined4 *)(*local_220 + local_228 * 4);
      }
      local_354 = local_450;
      requantize(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70,
                 (float)((ulong)in_stack_fffffffffffffb68 >> 0x20),(float)in_stack_fffffffffffffb68,
                 (float)((ulong)in_stack_fffffffffffffb60 >> 0x20),(int)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58,(int)((ulong)in_stack_fffffffffffffb50 >> 0x20));
    }
  }
  if (local_30c == 3) {
    Mat::create(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                (int)in_stack_fffffffffffffb68,(int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                (size_t)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    local_2c0 = local_300;
    bVar1 = true;
    if (*local_300 != 0) {
      local_98 = local_300;
      bVar1 = local_300[8] * (long)(int)local_300[7] == 0;
    }
    if (bVar1) {
      return -100;
    }
    for (local_358 = 0; local_358 < local_318; local_358 = local_358 + 1) {
      local_168 = local_3a8;
      local_2c = *(int *)((long)local_2f8 + 0x2c);
      local_30 = (int)local_2f8[6];
      local_34 = *(undefined4 *)((long)local_2f8 + 0x34);
      local_360 = *local_2f8 + local_2f8[8] * (long)local_358 * local_2f8[2];
      local_48 = local_2f8[2];
      local_4c = (undefined4)local_2f8[3];
      local_58 = local_2f8[4];
      local_28 = local_3a8;
      local_18 = (long)local_2c * (long)local_30 * local_48;
      local_2a8 = local_3a8;
      local_2e0 = local_3a8;
      local_1c = 0x10;
      local_174 = local_358;
      local_175 = 1;
      local_3a8[0] = 0;
      local_3a8[1] = 0;
      local_3a8[4] = 0;
      local_3a8[5] = 0;
      local_3a8[6] = 0;
      local_380 = 0;
      local_37c = 0;
      local_378 = 0;
      local_374 = 0;
      local_370 = 0;
      local_368 = 0;
      local_3a8[2] = 0;
      local_3a8[3] = 0;
      local_148 = &local_408;
      local_64 = *(int *)((long)local_300 + 0x2c);
      local_68 = (int)local_300[6];
      local_6c = *(undefined4 *)((long)local_300 + 0x34);
      local_3c0 = (Mat *)(*local_300 + local_300[8] * (long)local_358 * local_300[2]);
      local_80 = local_300[2];
      local_84 = (undefined4)local_300[3];
      local_90 = local_300[4];
      local_60 = &local_408;
      local_8 = (long)local_64 * (long)local_68 * local_80;
      local_298 = &local_408;
      local_2d0 = &local_408;
      local_c = 0x10;
      local_154 = local_358;
      local_155 = 1;
      local_408 = 0;
      local_3f8 = 0;
      local_3f0 = 0;
      local_3e0 = 0;
      local_3dc = 0;
      local_3d8 = 0;
      local_3d4 = 0;
      local_3d0 = 0;
      local_3c8 = 0;
      local_400 = 0;
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_230 = in_RDI + 0x128;
        local_238 = 0;
      }
      else {
        local_240 = in_RDI + 0x128;
        local_248 = (long)local_358;
      }
      if (*(int *)(in_RDI + 0xd8) != 0) {
        if (*(int *)(in_RDI + 0xd8) == 1) {
          local_250 = in_RDI + 0x1b8;
          local_258 = 0;
        }
        else {
          local_260 = in_RDI + 0x1b8;
          local_268 = (long)local_358;
        }
      }
      if (*(int *)(in_RDI + 0xd4) == 1) {
        local_270 = in_RDI + 0x170;
        local_278 = 0;
      }
      else {
        local_280 = in_RDI + 0x170;
        local_288 = (long)local_358;
      }
      local_100 = local_2d0;
      local_e0 = local_2e0;
      local_78 = local_3c0;
      local_40 = local_360;
      local_3e8 = local_90;
      local_388 = local_58;
      requantize(local_2e0,(char *)local_300,(float)((ulong)local_60 >> 0x20),SUB84(local_60,0),
                 (float)((ulong)in_stack_fffffffffffffb60 >> 0x20),(int)in_stack_fffffffffffffb60,
                 local_3c0,(int)((ulong)local_2d0 >> 0x20));
    }
  }
  return 0;
}

Assistant:

int Requantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;

    if (dims == 1)
    {
        top_blob.create(w, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        // assert scale_in_data_size == 1
        // assert bias_data_size == 0 || bias_data_size == 1
        // assert scale_out_data_size == 1

        const int* intptr = bottom_blob;
        signed char* ptr = top_blob;

        const float scale_in = scale_in_data[0];
        const float bias = bias_data_size == 0 ? 0.f : bias_data[0];
        const float scale_out = scale_out_data[0];

        requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
    }

    if (dims == 2)
    {
        top_blob.create(w, h, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            const int* intptr = bottom_blob.row<const int>(i);
            signed char* ptr = top_blob.row<signed char>(i);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[i];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[i];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[i];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w);
        }
    }

    if (dims == 3)
    {
        top_blob.create(w, h, channels, (size_t)1u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const int* intptr = bottom_blob.channel(q);
            signed char* ptr = top_blob.channel(q);

            const float scale_in = scale_in_data_size == 1 ? scale_in_data[0] : scale_in_data[q];
            const float bias = bias_data_size == 0 ? 0.f : bias_data_size == 1 ? bias_data[0] : bias_data[q];
            const float scale_out = scale_out_data_size == 1 ? scale_out_data[0] : scale_out_data[q];

            requantize(intptr, ptr, scale_in, bias, scale_out, activation_type, activation_params, w * h);
        }
    }

    return 0;
}